

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_pivot.cpp
# Opt level: O3

unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> __thiscall
duckdb::Binder::BindBoundPivot(Binder *this,PivotRef *ref)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *this_00;
  __node_base_ptr p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Head_base<0UL,_duckdb::BoundTableRef_*,_false> _Var2;
  size_type sVar3;
  pointer pcVar4;
  Value *pVVar5;
  _Head_base<0UL,_duckdb::BoundPivotRef_*,_false> _Var6;
  undefined8 uVar7;
  undefined8 uVar8;
  idx_t iVar9;
  pointer pBVar10;
  Binder *pBVar11;
  type node;
  reference pvVar12;
  reference __x;
  long *plVar13;
  pointer pEVar14;
  _Hash_node_base *p_Var15;
  type other;
  InternalException *this_02;
  ulong *puVar16;
  _Hash_node_base *p_Var17;
  _Hash_node_base *in_RDX;
  size_type __n;
  __node_base _Var18;
  _Hash_node_base *p_Var19;
  Value *this_03;
  size_type __n_00;
  bool bVar20;
  string subquery_alias;
  string pivot_str;
  vector<duckdb::LogicalType,_true> types;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  names;
  vector<duckdb::LogicalType,_true> child_types;
  string str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  child_names;
  _Head_base<0UL,_duckdb::BoundPivotRef_*,_false> local_180;
  undefined1 local_178 [40];
  __node_base local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  pointer local_128;
  optional_ptr<duckdb::Binder,_true> local_120;
  __node_base local_118;
  reference local_110;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_e8;
  vector<duckdb::LogicalType,_true> local_c8;
  _Hash_node_base *local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_a0;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_98;
  _Hash_node_base *local_90;
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_48;
  
  local_118._M_nxt = (_Hash_node_base *)this;
  local_180._M_head_impl = (BoundPivotRef *)operator_new(0x88);
  *(undefined1 *)
   &(((element_type *)local_180._M_head_impl)->super_enable_shared_from_this<duckdb::Binder>).
    __weak_this_.internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = 9;
  ((element_type *)local_180._M_head_impl)->context = (ClientContext *)0x0;
  *(undefined ***)
   &(((element_type *)local_180._M_head_impl)->super_enable_shared_from_this<duckdb::Binder>).
    __weak_this_.internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2> =
       &PTR__BoundPivotRef_0197d288;
  (((element_type *)local_180._M_head_impl)->CTE_bindings)._M_h._M_rehash_policy._M_next_resize = 0;
  (((element_type *)local_180._M_head_impl)->CTE_bindings)._M_h._M_single_bucket =
       (__node_base_ptr)0x0;
  (((element_type *)local_180._M_head_impl)->bound_ctes)._M_h._M_buckets = 0;
  (((element_type *)local_180._M_head_impl)->bound_ctes)._M_h._M_bucket_count = 0;
  (((element_type *)local_180._M_head_impl)->bound_ctes)._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (((element_type *)local_180._M_head_impl)->bound_ctes)._M_h._M_element_count = 0;
  *(undefined8 *)&(((element_type *)local_180._M_head_impl)->bound_ctes)._M_h._M_rehash_policy = 0;
  (((element_type *)local_180._M_head_impl)->bound_ctes)._M_h._M_rehash_policy._M_next_resize = 0;
  (((element_type *)local_180._M_head_impl)->bound_ctes)._M_h._M_single_bucket =
       (__node_base_ptr)0x0;
  (((element_type *)local_180._M_head_impl)->CTE_bindings)._M_h._M_bucket_count = 0;
  (((element_type *)local_180._M_head_impl)->CTE_bindings)._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (((element_type *)local_180._M_head_impl)->CTE_bindings)._M_h._M_element_count = 0;
  local_120.ptr = (Binder *)ref;
  iVar9 = GenerateTableIndex((Binder *)ref);
  pBVar10 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>::
            operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                        *)&local_180);
  pBVar10->bind_index = iVar9;
  CreateBinder((Binder *)local_178,(local_120.ptr)->context,local_120,REGULAR_BINDER);
  pBVar10 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>::
            operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                        *)&local_180);
  uVar8 = local_178._8_8_;
  uVar7 = local_178._0_8_;
  local_178._0_8_ = (element_type *)0x0;
  local_178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_01 = (pBVar10->child_binder).internal.
            super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pBVar10->child_binder).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)uVar7;
  (pBVar10->child_binder).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_);
    }
  }
  pBVar10 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>::
            operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                        *)&local_180);
  pBVar11 = shared_ptr<duckdb::Binder,_true>::operator->(&pBVar10->child_binder);
  unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator*
            ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
             (in_RDX + 0xd));
  Bind((Binder *)local_178,(TableRef *)pBVar11);
  pBVar10 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>::
            operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                        *)&local_180);
  uVar7 = local_178._0_8_;
  local_178._0_8_ = (element_type *)0x0;
  _Var2._M_head_impl =
       (pBVar10->child).
       super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
       super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
       super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl;
  (pBVar10->child).
  super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
  super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl = (BoundTableRef *)uVar7;
  if (_Var2._M_head_impl != (BoundTableRef *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_BoundTableRef + 8))();
    if ((element_type *)local_178._0_8_ != (element_type *)0x0) {
      (**(code **)(*(long *)local_178._0_8_ + 8))();
    }
  }
  local_128 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>::
              operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                          *)&local_180);
  pBVar10 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>::
            operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                        *)&local_180);
  node = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::
         operator*(&pBVar10->child);
  local_98 = &(local_128->bound_pivot).aggregates;
  ExtractPivotAggregates(node,local_98);
  local_150._M_nxt = in_RDX;
  if ((long)(local_128->bound_pivot).aggregates.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(local_128->bound_pivot).aggregates.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 3 ==
      (long)in_RDX[0x22]._M_nxt - (long)in_RDX[0x21]._M_nxt >> 5) {
    local_48.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pBVar10 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>::
              operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                          *)&local_180);
    pBVar11 = shared_ptr<duckdb::Binder,_true>::operator->(&pBVar10->child_binder);
    BindContext::GetTypesAndNames(&pBVar11->bind_context,&local_48,&local_c8);
    local_e8.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    p_Var15 = in_RDX[0x1f]._M_nxt;
    p_Var17 = p_Var15;
    if (p_Var15 != in_RDX[0x1e]._M_nxt) {
      this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 *)(local_150._M_nxt + 0x1e);
      __n_00 = 0;
      do {
        pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](this_00,__n_00);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_e8,pvVar12);
        __x = vector<duckdb::LogicalType,_true>::operator[](&local_c8,__n_00);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_108,
                   __x);
        __n_00 = __n_00 + 1;
        p_Var17 = local_150._M_nxt[0x1e]._M_nxt;
        p_Var15 = local_150._M_nxt[0x1f]._M_nxt;
      } while (__n_00 < (ulong)((long)p_Var15 - (long)p_Var17 >> 5));
    }
    p_Var19 = local_150._M_nxt[0x1b]._M_nxt;
    local_a8 = local_150._M_nxt[0x1c]._M_nxt;
    _Var18._M_nxt = local_150._M_nxt;
    if (p_Var19 != local_a8) {
      local_a0 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)(local_150._M_nxt + 0x21);
      p_Var1 = (__node_base_ptr)(local_68 + 0x10);
      p_Var15 = local_150._M_nxt[0x21]._M_nxt;
      p_Var17 = local_150._M_nxt[0x22]._M_nxt;
      do {
        bVar20 = p_Var17 != p_Var15;
        p_Var17 = p_Var15;
        if (bVar20) {
          __n = 0;
          local_90 = p_Var19;
          do {
            local_110 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                        ::operator[](local_98,__n);
            pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ::operator[](local_a0,__n);
            local_178._0_8_ = local_178 + 0x10;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_178,p_Var19[3]._M_nxt,
                       (long)&(p_Var19[4]._M_nxt)->_M_nxt + (long)p_Var19[3]._M_nxt);
            sVar3 = pvVar12->_M_string_length;
            if ((8 < (ulong)((long)(local_128->bound_pivot).aggregates.
                                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(local_128->bound_pivot).aggregates.
                                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                  .
                                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)) || (sVar3 != 0)) {
              if (sVar3 == 0) {
                pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          ::operator->(local_110);
                (*(pEVar14->super_BaseExpression)._vptr_BaseExpression[7])((string *)local_68);
              }
              else {
                pcVar4 = (pvVar12->_M_dataplus)._M_p;
                local_68._0_8_ = p_Var1;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)local_68,pcVar4,pcVar4 + sVar3);
              }
              plVar13 = (long *)::std::__cxx11::string::replace
                                          ((ulong)local_68,0,(char *)0x0,0x1384108);
              local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
              puVar16 = (ulong *)(plVar13 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar13 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar16) {
                local_148.field_2._M_allocated_capacity = *puVar16;
                local_148.field_2._8_8_ = plVar13[3];
              }
              else {
                local_148.field_2._M_allocated_capacity = *puVar16;
                local_148._M_dataplus._M_p = (pointer)*plVar13;
              }
              local_148._M_string_length = plVar13[1];
              *plVar13 = (long)puVar16;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              ::std::__cxx11::string::_M_append(local_178,(ulong)local_148._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_dataplus._M_p != &local_148.field_2) {
                operator_delete(local_148._M_dataplus._M_p);
              }
              if ((__node_base_ptr)local_68._0_8_ != p_Var1) {
                operator_delete((void *)local_68._0_8_);
              }
            }
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            local_148._M_string_length = 0;
            local_148.field_2._M_allocated_capacity =
                 local_148.field_2._M_allocated_capacity & 0xffffffffffffff00;
            pVVar5 = (Value *)p_Var19[1]._M_nxt;
            for (this_03 = (Value *)p_Var19->_M_nxt; this_03 != pVVar5; this_03 = this_03 + 1) {
              Value::ToString_abi_cxx11_((string *)local_68,this_03);
              if (local_148._M_string_length == 0) {
                ::std::__cxx11::string::operator=((string *)&local_148,(string *)local_68);
              }
              else {
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_88,"_",(string *)local_68);
                ::std::__cxx11::string::_M_append((char *)&local_148,local_88._0_8_);
                if ((_Hash_node_base *)local_88._0_8_ != (_Hash_node_base *)(local_88 + 0x10)) {
                  operator_delete((void *)local_88._0_8_);
                }
              }
              if ((__node_base_ptr)local_68._0_8_ != p_Var1) {
                operator_delete((void *)local_68._0_8_);
              }
            }
            pBVar10 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                      ::operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                                    *)&local_180);
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &(pBVar10->bound_pivot).pivot_values,&local_148);
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_178);
            pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator->(local_110);
            ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                      ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                       &local_108,&pEVar14->return_type);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p);
            }
            p_Var19 = local_90;
            if ((element_type *)local_178._0_8_ != (element_type *)(local_178 + 0x10)) {
              operator_delete((void *)local_178._0_8_);
            }
            __n = __n + 1;
            p_Var15 = local_150._M_nxt[0x21]._M_nxt;
            p_Var17 = local_150._M_nxt[0x22]._M_nxt;
          } while (__n < (ulong)((long)p_Var17 - (long)p_Var15 >> 5));
        }
        p_Var19 = p_Var19 + 7;
      } while (p_Var19 != local_a8);
      p_Var17 = local_150._M_nxt[0x1e]._M_nxt;
      p_Var15 = local_150._M_nxt[0x1f]._M_nxt;
      _Var18._M_nxt = local_150._M_nxt;
    }
    pBVar10 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>::
              operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                          *)&local_180);
    (pBVar10->bound_pivot).group_count = (long)p_Var15 - (long)p_Var17 >> 5;
    pBVar10 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>::
              operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                          *)&local_180);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
               &(pBVar10->bound_pivot).types,&local_108);
    local_178._0_8_ = local_178 + 0x10;
    if (_Var18._M_nxt[3]._M_nxt == (_Hash_node_base *)0x0) {
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"__unnamed_pivot","");
    }
    else {
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_178,_Var18._M_nxt[2]._M_nxt,
                 (long)&(_Var18._M_nxt[3]._M_nxt)->_M_nxt + (long)_Var18._M_nxt[2]._M_nxt);
    }
    QueryResult::DeduplicateColumns(&local_e8);
    pBVar10 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>::
              operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                          *)&local_180);
    BindContext::AddGenericBinding
              (&(local_120.ptr)->bind_context,pBVar10->bind_index,(string *)local_178,&local_e8,
               (vector<duckdb::LogicalType,_true> *)&local_108);
    pBVar10 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>::
              operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                          *)&local_180);
    other = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar10->child_binder);
    MoveCorrelatedExpressions(local_120.ptr,other);
    _Var6._M_head_impl = local_180._M_head_impl;
    local_180._M_head_impl = (BoundPivotRef *)0x0;
    (((enable_shared_from_this<duckdb::Binder> *)&(local_118._M_nxt)->_M_nxt)->__weak_this_).
    internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var6._M_head_impl;
    if ((element_type *)local_178._0_8_ != (element_type *)(local_178 + 0x10)) {
      operator_delete((void *)local_178._0_8_);
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_108);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_e8);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_c8);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
    if (local_180._M_head_impl != (BoundPivotRef *)0x0) {
      (*((local_180._M_head_impl)->super_BoundTableRef)._vptr_BoundTableRef[1])();
    }
    return (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
           (_Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)
           local_118._M_nxt;
  }
  this_02 = (InternalException *)__cxa_allocate_exception(0x10);
  local_178._0_8_ = local_178 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_178,"Pivot aggregate count mismatch (expected %llu, found %llu)","");
  InternalException::InternalException<unsigned_long,unsigned_long>
            (this_02,(string *)local_178,
             (long)local_150._M_nxt[0x22]._M_nxt - (long)local_150._M_nxt[0x21]._M_nxt >> 5,
             (long)(local_128->bound_pivot).aggregates.
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(local_128->bound_pivot).aggregates.
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<BoundTableRef> Binder::BindBoundPivot(PivotRef &ref) {
	// bind the child table in a child binder
	auto result = make_uniq<BoundPivotRef>();
	result->bind_index = GenerateTableIndex();
	result->child_binder = Binder::CreateBinder(context, this);
	result->child = result->child_binder->Bind(*ref.source);

	auto &aggregates = result->bound_pivot.aggregates;
	ExtractPivotAggregates(*result->child, aggregates);
	if (aggregates.size() != ref.bound_aggregate_names.size()) {
		throw InternalException("Pivot aggregate count mismatch (expected %llu, found %llu)",
		                        ref.bound_aggregate_names.size(), aggregates.size());
	}

	vector<string> child_names;
	vector<LogicalType> child_types;
	result->child_binder->bind_context.GetTypesAndNames(child_names, child_types);

	vector<string> names;
	vector<LogicalType> types;
	// emit the groups
	for (idx_t i = 0; i < ref.bound_group_names.size(); i++) {
		names.push_back(ref.bound_group_names[i]);
		types.push_back(child_types[i]);
	}
	// emit the pivot columns
	for (auto &pivot_value : ref.bound_pivot_values) {
		for (idx_t aggr_idx = 0; aggr_idx < ref.bound_aggregate_names.size(); aggr_idx++) {
			auto &aggr = aggregates[aggr_idx];
			auto &aggr_name = ref.bound_aggregate_names[aggr_idx];
			auto name = pivot_value.name;
			if (aggregates.size() > 1 || !aggr_name.empty()) {
				// if there are multiple aggregates specified we add the name of the aggregate as well
				name += "_" + (aggr_name.empty() ? aggr->GetName() : aggr_name);
			}
			string pivot_str;
			for (auto &value : pivot_value.values) {
				auto str = value.ToString();
				if (pivot_str.empty()) {
					pivot_str = std::move(str);
				} else {
					pivot_str += "_" + str;
				}
			}
			result->bound_pivot.pivot_values.push_back(std::move(pivot_str));
			names.push_back(std::move(name));
			types.push_back(aggr->return_type);
		}
	}
	result->bound_pivot.group_count = ref.bound_group_names.size();
	result->bound_pivot.types = types;
	auto subquery_alias = ref.alias.empty() ? "__unnamed_pivot" : ref.alias;
	QueryResult::DeduplicateColumns(names);
	bind_context.AddGenericBinding(result->bind_index, subquery_alias, names, types);

	MoveCorrelatedExpressions(*result->child_binder);
	return std::move(result);
}